

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O1

void __thiscall
vera::renderQuilt(vera *this,
                 function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                 *_renderFnc,int _viewIndex,bool _justQuilt)

{
  col_type *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Camera *pCVar6;
  undefined4 extraout_var;
  Vbo *this_00;
  socklen_t __len;
  undefined7 in_register_00000009;
  _func_int **pp_Var7;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  uint32_t __fd;
  int iVar8;
  int iVar9;
  vec4 vp;
  vec4 vp_1;
  uint32_t local_ac;
  float local_a8;
  uint32_t local_a4;
  int local_a0;
  float local_9c;
  mat4 local_98;
  undefined1 local_50 [8];
  float local_48;
  float local_44;
  char local_40 [16];
  
  __fd = (uint32_t)_renderFnc;
  __len = (socklen_t)CONCAT71(in_register_00000009,_justQuilt);
  local_a4 = __fd;
  pCVar6 = getCamera();
  if (pCVar6 != (Camera *)0x0) {
    if ((char)_viewIndex == '\0') {
      if (quilt_fbo[0x30] == '\0') {
        __len = 1;
        __fd = quilt;
        Fbo::allocate((Fbo *)quilt_fbo,quilt,DAT_00443948,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                      true);
      }
      iVar2 = (*(pCVar6->super_Node)._vptr_Node[0x4a])(pCVar6);
      __addr = extraout_RDX;
      if (*(int *)CONCAT44(extraout_var,iVar2) != 2) {
        uVar3 = getWindowWidth();
        uVar4 = getWindowHeight();
        pp_Var7 = (pCVar6->super_Node)._vptr_Node;
        (*pp_Var7[0x3e])(pCVar6,(ulong)uVar3,(ulong)uVar4);
        __len = (socklen_t)pp_Var7;
        __fd = 2;
        (*(pCVar6->super_Node)._vptr_Node[0x39])(pCVar6);
        __addr = extraout_RDX_00;
      }
      Fbo::bind((Fbo *)quilt_fbo,__fd,__addr,__len);
    }
    if (local_a4 == 0xffffffff) {
      local_a0 = _viewIndex;
      glGetIntegerv(0xba2,&local_98);
      local_ac = 0;
      _viewIndex = local_a0;
      if (0 < DAT_00443954) {
        iVar2 = (int)((float)(int)quilt / (float)DAT_0044394c);
        iVar5 = (int)((float)(int)DAT_00443948 / (float)_DAT_00443950);
        local_a8 = (float)iVar2;
        local_9c = (float)iVar5;
        do {
          iVar8 = ((int)local_ac % DAT_0044394c) * iVar2;
          iVar9 = (int)((float)(int)local_ac / (float)DAT_0044394c) * iVar5;
          glViewport(iVar8,iVar9,iVar2,iVar5);
          glEnable(0xc11);
          glScissor(iVar8,iVar9,iVar2,iVar5);
          local_50._4_4_ = (float)iVar9;
          local_50._0_4_ = (float)iVar8;
          local_48 = local_a8;
          local_44 = local_9c;
          currentViewIndex = local_ac;
          if (*(long *)(this + 0x10) == 0) goto LAB_00254539;
          (**(code **)(this + 0x18))(this,&quilt,local_50,&local_ac);
          glViewport(local_98.value[0].field_0.x,local_98.value[0].field_1.y,
                     local_98.value[0].field_2.z,local_98.value._12_8_ & 0xffffffff);
          glDisable(0xc11);
          glScissor(local_98.value[0].field_0.x,local_98.value[0].field_1.y,
                    local_98.value[0].field_2.z,local_98.value._12_8_ & 0xffffffff);
          local_ac = local_ac + 1;
          _viewIndex = local_a0;
        } while ((int)local_ac < DAT_00443954);
      }
    }
    else {
      currentViewIndex = local_a4;
      iVar2 = getWindowWidth();
      local_a8 = (float)iVar2;
      iVar2 = getWindowHeight();
      local_98.value[0].field_0.x = 0.0;
      local_98.value[0].field_1.y = 0.0;
      local_98.value[0].field_2.z = local_a8;
      local_98.value[0].field_3.w = (float)iVar2;
      if (*(long *)(this + 0x10) == 0) {
LAB_00254539:
        std::__throw_bad_function_call();
      }
      (**(code **)(this + 0x18))(this,&quilt,&local_98);
    }
    if ((char)_viewIndex == '\0') {
      Fbo::unbind((Fbo *)quilt_fbo);
      Shader::use((Shader *)quilt_shader);
      feedLenticularUniforms((Shader *)quilt_shader);
      pcVar1 = local_98.value + 1;
      local_98.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_scene","");
      Shader::setUniformTexture((Shader *)quilt_shader,(string *)&local_98,(Fbo *)quilt_fbo,0);
      if ((col_type *)local_98.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      local_98.value[0]._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_resolution","");
      iVar2 = getWindowWidth();
      iVar5 = getWindowHeight();
      Shader::setUniform((Shader *)quilt_shader,(string *)&local_98,(float)iVar2,(float)iVar5);
      if ((col_type *)local_98.value[0]._0_8_ != pcVar1) {
        operator_delete((void *)local_98.value[0]._0_8_);
      }
      local_50 = (undefined1  [8])local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"u_modelViewProjectionMatrix","");
      local_98.value[0].field_0.x = 1.0;
      local_98.value[0].field_1.y = 0.0;
      local_98.value[0].field_2.z = 0.0;
      local_98.value._12_8_ = 0;
      local_98.value[1].field_1.y = 1.0;
      local_98.value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      local_98.value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      local_98.value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      local_98.value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      local_98.value[2].field_2.z = 1.0;
      local_98.value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      local_98.value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      local_98.value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      local_98.value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      local_98.value[3].field_3.w = 1.0;
      Shader::setUniform((Shader *)quilt_shader,(string *)local_50,&local_98,false);
      if (local_50 != (undefined1  [8])local_40) {
        operator_delete((void *)local_50);
      }
      this_00 = getBillboard();
      Vbo::render(this_00,(Shader *)quilt_shader);
    }
  }
  return;
}

Assistant:

void renderQuilt(std::function<void(const QuiltProperties&, glm::vec4&, int&)> _renderFnc, int _viewIndex, bool _justQuilt) {
    Camera* cam = getCamera();
    if (!cam)
        return;

    if (!_justQuilt) {

        if (!quilt_fbo.isAllocated())
            quilt_fbo.allocate(quilt.width, quilt.height, COLOR_TEXTURE_DEPTH_BUFFER);

        if (cam)
            if (cam->getProjectionType() != ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET) {
                // cam->setAspect(1.0);
                cam->setViewport(getWindowWidth(),getWindowHeight());
                // cam->setFOV(glm::radians(14.0f));
                cam->setProjection(ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET);
                // cam->setClipping(0.01, 100.0);
            }

        quilt_fbo.bind();
    }

    if (_viewIndex == -1) {
        // save the viewport for the total quilt
        GLint viewport[4];
        glGetIntegerv(GL_VIEWPORT, viewport);

        // get quilt view dimensions
        int qs_viewWidth = int(float(quilt.width) / float(quilt.columns));
        int qs_viewHeight = int(float(quilt.height) / float(quilt.rows));

        // render views and copy each view to the quilt
        for (int viewIndex = 0; viewIndex < quilt.totalViews; viewIndex++) {
            // get the x and y origin for this view
            int x = (viewIndex % quilt.columns) * qs_viewWidth;
            int y = int(float(viewIndex) / float(quilt.columns)) * qs_viewHeight;

            // get the x and y origin for this view
            // set the viewport to the view to control the projection extent
            glViewport(x, y, qs_viewWidth, qs_viewHeight);

            // // set the scissor to the view to restrict calls like glClear from making modifications
            glEnable(GL_SCISSOR_TEST);
            glScissor(x, y, qs_viewWidth, qs_viewHeight);
            glm::vec4 vp = glm::vec4(x, y, qs_viewWidth, qs_viewHeight);

            currentViewIndex = viewIndex;
            
            _renderFnc(quilt, vp, viewIndex);

            // reset viewport
            glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

            // // restore scissor
            glDisable(GL_SCISSOR_TEST);
            glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);
        }

    }
    else {
        currentViewIndex = _viewIndex;
        glm::vec4 vp = glm::vec4(0.0, 0.0, float(vera::getWindowWidth()), float(vera::getWindowHeight()));
        _renderFnc(quilt, vp, _viewIndex);
    }

    if (!_justQuilt) {
        quilt_fbo.unbind();

        quilt_shader.use();
        feedLenticularUniforms( quilt_shader );
        quilt_shader.setUniformTexture("u_scene", &quilt_fbo, 0);
        quilt_shader.setUniform("u_resolution", float(vera::getWindowWidth()), float(vera::getWindowHeight()) );
        quilt_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.));
        vera::getBillboard()->render( &quilt_shader );
    }
}